

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

ssize_t __thiscall
xs::ProcessFinishedMessage::write(ProcessFinishedMessage *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  MessageWriter local_20;
  MessageWriter writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buf_local;
  ProcessFinishedMessage *this_local;
  
  writer.m_buf = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_register_00000034,__fd);
  MessageWriter::MessageWriter(&local_20,(this->super_Message).type,writer.m_buf);
  MessageWriter::put<int>(&local_20,*(int *)&(this->super_Message).field_0xc);
  MessageWriter::~MessageWriter(&local_20);
  return extraout_RAX;
}

Assistant:

void ProcessFinishedMessage::write (vector<deUint8>& buf) const
{
	MessageWriter writer(type, buf);
	writer.put(exitCode);
}